

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::substring::merge_forward<char*,bitmap::BitmapArray<long>::iterator,long*>
               (char *T,iterator PA,long *buf,iterator first,iterator middle,iterator last,
               value_type depth)

{
  iterator first1;
  iterator p2;
  iterator p1;
  bool bVar1;
  int iVar2;
  difference_type dVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long *in_RCX;
  long *plVar7;
  long *plVar8;
  reference rVar9;
  iterator iVar10;
  int r;
  value_type t;
  long *bufend;
  long *j;
  iterator k;
  iterator i;
  iterator *in_stack_fffffffffffffd28;
  iterator *this;
  value_reference *in_stack_fffffffffffffd30;
  BitmapArray<long> *in_stack_fffffffffffffd38;
  pos_type in_stack_fffffffffffffd40;
  BitmapArray<long> *in_stack_fffffffffffffd48;
  pos_type in_stack_fffffffffffffd50;
  reference in_stack_fffffffffffffdd0;
  BitmapArray<long> *in_stack_fffffffffffffde0;
  BitmapArray<long> *in_stack_fffffffffffffde8;
  BitmapArray<long> *in_stack_fffffffffffffdf0;
  BitmapArray<long> *in_stack_fffffffffffffdf8;
  BitmapArray<long> *in_stack_fffffffffffffe00;
  long *local_58;
  iterator local_50;
  iterator local_40;
  long *local_30;
  iterator local_20 [2];
  
  local_30 = in_RCX;
  bitmap::BitmapArray<long>::iterator::iterator(&local_40);
  bitmap::BitmapArray<long>::iterator::iterator(&local_50);
  plVar7 = local_30;
  dVar3 = bitmap::BitmapArray<long>::iterator::operator-((iterator *)&stack0x00000008,local_20);
  plVar7 = plVar7 + dVar3;
  first1.pos_ = in_stack_fffffffffffffd50;
  first1.array_ = in_stack_fffffffffffffd48;
  iVar10.pos_ = in_stack_fffffffffffffd40;
  iVar10.array_ = in_stack_fffffffffffffd38;
  helper::vecswap<bitmap::BitmapArray<long>::iterator,long*>
            (first1,iVar10,(long *)in_stack_fffffffffffffd30);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122b3f);
  lVar4 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x122b5c);
  bitmap::BitmapArray<long>::iterator::operator=(&local_40,local_20);
  local_58 = local_30;
  bitmap::BitmapArray<long>::iterator::operator=(&local_50,(iterator *)&stack0x00000008);
  do {
    while( true ) {
      while( true ) {
        bitmap::BitmapArray<long>::iterator::operator+
                  ((iterator *)in_stack_fffffffffffffd38,(difference_type)in_stack_fffffffffffffd30)
        ;
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122bdd);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x122bfa);
        bitmap::BitmapArray<long>::iterator::operator+
                  ((iterator *)in_stack_fffffffffffffd38,(difference_type)in_stack_fffffffffffffd30)
        ;
        p1.pos_ = (pos_type)in_stack_fffffffffffffe00;
        p1.array_ = in_stack_fffffffffffffdf8;
        p2.pos_ = (pos_type)in_stack_fffffffffffffdf0;
        p2.array_ = in_stack_fffffffffffffde8;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>
                          ((char *)in_stack_fffffffffffffde0,p1,p2,in_stack_fffffffffffffdd0.pos_);
        if (-1 < iVar2) break;
        do {
          bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffd28,0);
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122c9f);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffffd30,(long)in_stack_fffffffffffffd28);
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122cce);
          lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x122ceb);
          plVar8 = local_58 + 1;
          *local_58 = lVar5;
          if (plVar7 <= plVar8) {
            plVar7[-1] = lVar4;
            return;
          }
          local_58 = plVar8;
        } while (*plVar8 < 0);
      }
      if (0 < iVar2) break;
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122f71);
      uVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x122f8e);
      in_stack_fffffffffffffd38 = (BitmapArray<long> *)(uVar6 ^ 0xffffffffffffffff);
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122fa4);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffffd30,(long)in_stack_fffffffffffffd28);
      do {
        in_stack_fffffffffffffd30 = (value_reference *)*local_58;
        bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffd28,0);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123002);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffffd30,(long)in_stack_fffffffffffffd28);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123031);
        lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x12304e);
        plVar8 = local_58 + 1;
        *local_58 = lVar5;
        if (plVar7 <= plVar8) {
          plVar7[-1] = lVar4;
          return;
        }
        local_58 = plVar8;
      } while (*plVar8 < 0);
      do {
        rVar9 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1230b9);
        in_stack_fffffffffffffe00 = rVar9.array_;
        iVar10 = bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffd28,0);
        in_stack_fffffffffffffde0 = iVar10.array_;
        in_stack_fffffffffffffde8 = (BitmapArray<long> *)iVar10.pos_;
        rVar9 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1230f5);
        in_stack_fffffffffffffdf0 = rVar9.array_;
        in_stack_fffffffffffffdf8 = (BitmapArray<long> *)rVar9.pos_;
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffffd30,(value_reference *)in_stack_fffffffffffffd28);
        in_stack_fffffffffffffdd0 =
             bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123127);
        bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffd28,0);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123163);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffffd30,(value_reference *)in_stack_fffffffffffffd28);
        bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                          ((iterator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        if (bVar1) {
          do {
            this = (iterator *)*local_58;
            bitmap::BitmapArray<long>::iterator::operator++(this,0);
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1231d7);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffffd30,(long)this);
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1231ff);
            lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x123213);
            plVar8 = local_58 + 1;
            *local_58 = lVar5;
            local_58 = plVar8;
          } while (plVar8 < plVar7);
          plVar7[-1] = lVar4;
          return;
        }
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12326b);
        lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x12327f);
      } while (lVar5 < 0);
    }
    do {
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122d69);
      bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffd28,0);
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122da5);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffffd30,(value_reference *)in_stack_fffffffffffffd28);
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122dd7);
      bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffd28,0);
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122e13);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffffd30,(value_reference *)in_stack_fffffffffffffd28);
      bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                        ((iterator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      if (bVar1) {
        do {
          bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffd28,0);
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122e91);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffffd30,(long)in_stack_fffffffffffffd28);
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122ec0);
          lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x122edd);
          plVar8 = local_58 + 1;
          *local_58 = lVar5;
          local_58 = plVar8;
        } while (plVar8 < plVar7);
        plVar7[-1] = lVar4;
        return;
      }
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x122f38);
      lVar5 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x122f55);
    } while (lVar5 < 0);
  } while( true );
}

Assistant:

void merge_forward(
    const StringIterator_type T, const SAIterator_type PA, BufIterator_type buf,
    SAIterator_type first, SAIterator_type middle, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type i, k;
  BufIterator_type j, bufend;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r;

  bufend = buf + (middle - first);
  helper::vecswap(first, middle, buf);

  for (t = *first, i = first, j = buf, k = middle;;) {
    r = compare(T, PA + *j, PA + *k, depth);
    if (r < 0) {
      do {
        *i++ = *j;
        *j++ = *i;
        if (bufend <= j) {
          *(bufend - 1) = t;
          return;
        }
      } while (*j < 0);
    } else if (r > 0) {
      do {
        *i++ = *k;
        *k++ = *i;
        if (last <= k) {
          do {
            *i++ = *j;
            *j++ = *i;
          } while (j < bufend);
          *(bufend - 1) = t;
          return;
        }
      } while (*k < 0);
    } else {
      *k = ~*k;
      do {
        *i++ = *j;
        *j++ = *i;
        if (bufend <= j) {
          *(bufend - 1) = t;
          return;
        }
      } while (*j < 0);

      do {
        *i++ = *k;
        *k++ = *i;
        if (last <= k) {
          do {
            *i++ = *j;
            *j++ = *i;
          } while (j < bufend);
          *(bufend - 1) = t;
          return;
        }
      } while (*k < 0);
    }
  }
}